

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::ScopedProperty2
          (ByteCodeWriter *this,OpCode op,RegSlot value,PropertyIdIndexType propertyIdIndex,
          RegSlot value2)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  RegSlot value2_00;
  undefined4 *puVar3;
  OpCode op_00;
  FunctionBody *pFVar4;
  PropertyIdIndexType propertyIdIndex_00;
  RegSlot local_40;
  RegSlot local_3c;
  PropertyIdIndexType local_38;
  PropertyIdIndexType local_34;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3a);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  local_34 = propertyIdIndex;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8cd,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_00893dd3;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    pFVar4 = this->m_functionWrite;
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_00893dd3;
      *puVar3 = 0;
      pFVar4 = this->m_functionWrite;
    }
    propertyIdIndex_00 = local_34;
    value_00 = FunctionBody::MapRegSlot(pFVar4,value);
    if (value2 != 0xffffffff) {
      pFVar4 = this->m_functionWrite;
      if (pFVar4 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_00893dd3;
        *puVar3 = 0;
        pFVar4 = this->m_functionWrite;
        propertyIdIndex_00 = local_34;
      }
      value2_00 = FunctionBody::MapRegSlot(pFVar4,value2);
      if (op == ScopedLdInst) {
        op_00 = ScopedLdInst;
LAB_00893d14:
        bVar2 = TryWriteElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op_00,value_00,propertyIdIndex_00,value2_00);
        if (!bVar2) {
          bVar2 = TryWriteElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,op,value_00,propertyIdIndex_00,value2_00);
          if (!bVar2) {
            local_40 = value_00;
            local_3c = value2_00;
            local_38 = propertyIdIndex_00;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
            Data::Write(&this->m_byteCodeData,&local_40,0xc);
          }
        }
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x8d8,"(false)",
                                  "The specified OpCode is not intended for field-access with a second instance"
                                 );
      if (bVar2) {
        *puVar3 = 0;
        propertyIdIndex_00 = local_34;
        op_00 = op;
        goto LAB_00893d14;
      }
      goto LAB_00893dd3;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_00893dd3:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::ScopedProperty2(OpCode op, RegSlot value, PropertyIdIndexType propertyIdIndex, RegSlot value2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementScopedC2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        value2 = ConsumeReg(value2);

        switch (op)
        {
        case OpCode::ScopedLdInst:
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for field-access with a second instance");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementScopedC2, op, value, propertyIdIndex, value2);
    }